

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveAlignFill::writeTempData(CDirectiveAlignFill *this,TempData *tempData)

{
  int iVar1;
  int64_t iVar2;
  char *in_R8;
  string local_88;
  string local_68;
  string local_38;
  TempData *local_18;
  TempData *tempData_local;
  CDirectiveAlignFill *this_local;
  
  iVar1 = *(int *)&(this->super_CAssemblerCommand).field_0x14;
  local_18 = tempData;
  tempData_local = (TempData *)this;
  if (iVar1 == 0) {
    iVar2 = this->virtualAddress;
    tinyformat::format<long>(&local_68,".aligna 0x%08X",&this->value);
    TempData::writeLine(tempData,iVar2,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else if (iVar1 == 1) {
    iVar2 = this->virtualAddress;
    tinyformat::format<long>(&local_38,".align 0x%08X",&this->value);
    TempData::writeLine(tempData,iVar2,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else if (iVar1 == 2) {
    iVar2 = this->virtualAddress;
    tinyformat::format<long,signed_char>
              (&local_88,(tinyformat *)".fill 0x%08X,0x%02X",(char *)&this->value,
               (long *)&this->fillByte,in_R8);
    TempData::writeLine(tempData,iVar2,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return;
}

Assistant:

void CDirectiveAlignFill::writeTempData(TempData& tempData) const
{
	switch (mode)
	{
	case AlignVirtual:
		tempData.writeLine(virtualAddress,tfm::format(".align 0x%08X",value));
		break;
	case AlignPhysical:
		tempData.writeLine(virtualAddress, tfm::format(".aligna 0x%08X", value));
		break;
	case Fill:
		tempData.writeLine(virtualAddress,tfm::format(".fill 0x%08X,0x%02X",value,fillByte));
		break;
	}
}